

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
test::iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test::Body
          (iu_FilePath_x_iutest_x_RemoveTrailingPathSeparator_Test *this)

{
  iuFilePath *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::detail::iuFilePath::iuFilePath(&path);
  iutest::detail::iuFilePath::RemoveTrailingPathSeparator((iuFilePath *)&local_190,&path);
  iutest::internal::CmpHelperEQ<char[1],iutest::detail::iuFilePath>
            (&iutest_ar,(internal *)"\"\"","path.RemoveTrailingPathSeparator()","",
             (char (*) [1])&local_190,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x6f,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&path);
  iutest::detail::iuFilePath::iuFilePath(&path,"path/to/dir/////");
  iutest::detail::iuFilePath::RemoveTrailingPathSeparator((iuFilePath *)&local_190,&path);
  iutest::internal::CmpHelperEQ<char[12],iutest::detail::iuFilePath>
            (&iutest_ar,(internal *)"\"path/to/dir\"","path.RemoveTrailingPathSeparator()",
             "path/to/dir",(char (*) [12])&local_190,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x76,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

IUTEST(FilePath, RemoveTrailingPathSeparator)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_EQ("", path.RemoveTrailingPathSeparator());
    }
    {
        ::iutest::internal::FilePath path("path/to/dir/////");
#ifdef IUTEST_OS_WINDOWS
        IUTEST_EXPECT_EQ("path\\to\\dir", path.RemoveTrailingPathSeparator());
#else
        IUTEST_EXPECT_EQ("path/to/dir", path.RemoveTrailingPathSeparator());
#endif
    }
}